

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

void __thiscall QTest::TestMethods::invokeTestOnData(TestMethods *this,int index)

{
  QMetaMethod m;
  QMetaMethod m_00;
  QMetaMethod m_01;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  const_reference pvVar4;
  QCoreApplication *pQVar5;
  QBenchmarkResult *pQVar6;
  iterator iVar7;
  iterator iVar8;
  long in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar9;
  bool testPassed;
  qreal total;
  QBenchmarkResult *first;
  bool initQuit;
  bool invokeOk;
  bool minimumTotalReached;
  int i;
  bool isBenchmark;
  anon_class_1_0_00000001 addResult;
  QString pattern;
  QList<QList<QBenchmarkResult>_> resultsList;
  parameter_type in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe64;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  undefined1 in_stack_fffffffffffffe68;
  byte bVar10;
  undefined1 in_stack_fffffffffffffe69;
  undefined1 in_stack_fffffffffffffe6a;
  char in_stack_fffffffffffffe6b;
  int in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  QString *in_stack_fffffffffffffe78;
  iterator in_stack_fffffffffffffe88;
  QObject *in_stack_fffffffffffffe90;
  QList<QBenchmarkResult> *in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea1;
  undefined1 in_stack_fffffffffffffea2;
  undefined1 in_stack_fffffffffffffea3;
  undefined1 in_stack_fffffffffffffea4;
  byte in_stack_fffffffffffffea5;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  Data in_stack_fffffffffffffea8;
  QList<QList<QBenchmarkResult>_> *in_stack_fffffffffffffeb0;
  bool local_13a;
  bool local_f5;
  int local_e4;
  bool local_dd;
  QChar local_b2;
  QString local_b0 [2];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QMetaObject *local_58;
  uint *puStack_50;
  QLatin1String *local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_dd = false;
  uVar2 = (*QBenchmarkGlobalData::current->measurer->_vptr_QBenchmarkMeasurerBase[7])();
  local_e4 = 0;
  if ((uVar2 & 1) != 0) {
    local_e4 = -1;
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QList<QBenchmarkResult>_>::QList((QList<QList<QBenchmarkResult>_> *)0x14d7a3);
  do {
    QBenchmarkTestMethodData::beginDataRun
              ((QBenchmarkTestMethodData *)
               CONCAT17(in_stack_fffffffffffffe67,
                        CONCAT16(in_stack_fffffffffffffe66,
                                 CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60))));
    if (local_e4 < 0) {
      QBenchmarkTestMethodData::current->iterationCount = 1;
    }
    do {
      inTestFunction = 1;
      local_38 = *(undefined8 *)(in_RDI + 0x30);
      uStack_30 = *(undefined8 *)(in_RDI + 0x38);
      m.mobj._1_1_ = in_stack_fffffffffffffea1;
      m.mobj._0_1_ = in_stack_fffffffffffffea0;
      m.mobj._2_1_ = in_stack_fffffffffffffea2;
      m.mobj._3_1_ = in_stack_fffffffffffffea3;
      m.mobj._4_1_ = in_stack_fffffffffffffea4;
      m.mobj._5_1_ = in_stack_fffffffffffffea5;
      m.mobj._6_1_ = in_stack_fffffffffffffea6;
      m.mobj._7_1_ = in_stack_fffffffffffffea7;
      m.data.d = in_stack_fffffffffffffea8.d;
      invokeTestMethodIfValid(m,in_stack_fffffffffffffe90);
      bVar1 = QTestResult::skipCurrentTest();
      local_13a = true;
      if (!bVar1) {
        local_13a = QTestResult::currentTestFailed();
      }
      if (local_13a == false) {
        QList<QBenchmarkResult>::clear
                  ((QList<QBenchmarkResult> *)
                   CONCAT17(in_stack_fffffffffffffe67,
                            CONCAT16(in_stack_fffffffffffffe66,
                                     CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)))
                  );
        QBenchmarkTestMethodData::current->resultAccepted = false;
        QBenchmarkTestMethodData::current->valid = false;
        pcVar3 = QTestResult::currentDataTag();
        if (pcVar3 == (char *)0x0) {
          in_stack_fffffffffffffea8.d = (uint *)0x1b6819;
        }
        else {
          in_stack_fffffffffffffea8.d = (uint *)QTestResult::currentDataTag();
          in_stack_fffffffffffffeb0 = (QList<QList<QBenchmarkResult>_> *)in_stack_fffffffffffffea8.d
          ;
        }
        QLatin1String::QLatin1String
                  ((QLatin1String *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (char *)CONCAT44(in_stack_fffffffffffffe6c,
                                    CONCAT13(in_stack_fffffffffffffe6b,
                                             CONCAT12(in_stack_fffffffffffffe6a,
                                                      CONCAT11(in_stack_fffffffffffffe69,
                                                               in_stack_fffffffffffffe68)))));
        QString::operator=(&(QBenchmarkGlobalData::current->context).tag,local_48);
        pvVar4 = std::vector<QMetaMethod,_std::allocator<QMetaMethod>_>::operator[]
                           ((vector<QMetaMethod,_std::allocator<QMetaMethod>_> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            CONCAT44(in_stack_fffffffffffffe6c,
                                     CONCAT13(in_stack_fffffffffffffe6b,
                                              CONCAT12(in_stack_fffffffffffffe6a,
                                                       CONCAT11(in_stack_fffffffffffffe69,
                                                                in_stack_fffffffffffffe68)))));
        local_58 = pvVar4->mobj;
        puStack_50 = (pvVar4->data).d;
        m_00.mobj._1_1_ = in_stack_fffffffffffffea1;
        m_00.mobj._0_1_ = in_stack_fffffffffffffea0;
        m_00.mobj._2_1_ = in_stack_fffffffffffffea2;
        m_00.mobj._3_1_ = in_stack_fffffffffffffea3;
        m_00.mobj._4_1_ = in_stack_fffffffffffffea4;
        m_00.mobj._5_1_ = in_stack_fffffffffffffea5;
        m_00.mobj._6_1_ = in_stack_fffffffffffffea6;
        m_00.mobj._7_1_ = in_stack_fffffffffffffea7;
        m_00.data.d = in_stack_fffffffffffffea8.d;
        local_f5 = invokeTestMethodIfValid(m_00,in_stack_fffffffffffffe90);
        in_stack_fffffffffffffea7 = local_f5;
        if (!local_f5) {
          QTestResult::addFailure
                    ((char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     (char *)CONCAT44(in_stack_fffffffffffffe6c,
                                      CONCAT13(in_stack_fffffffffffffe6b,
                                               CONCAT12(in_stack_fffffffffffffe6a,
                                                        CONCAT11(in_stack_fffffffffffffe69,
                                                                 in_stack_fffffffffffffe68)))),
                     CONCAT13(in_stack_fffffffffffffe67,
                              CONCAT12(in_stack_fffffffffffffe66,in_stack_fffffffffffffe64)));
        }
        in_stack_fffffffffffffea6 =
             QBenchmarkTestMethodData::isBenchmark(QBenchmarkTestMethodData::current);
        local_dd = (bool)in_stack_fffffffffffffea6;
      }
      else {
        local_f5 = false;
      }
      inTestFunction = 0;
      QTestResult::finishedCurrentTestData();
      if (local_13a == false) {
        local_68 = *(undefined8 *)(in_RDI + 0x40);
        uStack_60 = *(undefined8 *)(in_RDI + 0x48);
        m_01.mobj._1_1_ = in_stack_fffffffffffffea1;
        m_01.mobj._0_1_ = in_stack_fffffffffffffea0;
        m_01.mobj._2_1_ = in_stack_fffffffffffffea2;
        m_01.mobj._3_1_ = in_stack_fffffffffffffea3;
        m_01.mobj._4_1_ = in_stack_fffffffffffffea4;
        m_01.mobj._5_1_ = in_stack_fffffffffffffea5;
        m_01.mobj._6_1_ = in_stack_fffffffffffffea6;
        m_01.mobj._7_1_ = in_stack_fffffffffffffea7;
        m_01.data.d = in_stack_fffffffffffffea8.d;
        invokeTestMethodIfValid(m_01,in_stack_fffffffffffffe90);
        pQVar5 = QCoreApplication::instance();
        if (pQVar5 != (QCoreApplication *)0x0) {
          QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
        }
      }
      if (local_dd == false) {
        QTestResult::finishedCurrentTestDataCleanup();
      }
      in_stack_fffffffffffffea5 = 0;
      if ((local_f5 != false) && (in_stack_fffffffffffffea5 = 0, local_dd != false)) {
        in_stack_fffffffffffffea4 =
             QBenchmarkTestMethodData::resultsAccepted(QBenchmarkTestMethodData::current);
        in_stack_fffffffffffffea5 = 0;
        if (!(bool)in_stack_fffffffffffffea4) {
          in_stack_fffffffffffffea3 = QTestResult::skipCurrentTest();
          in_stack_fffffffffffffea5 = 0;
          if (!(bool)in_stack_fffffffffffffea3) {
            in_stack_fffffffffffffea2 = QTestResult::currentTestFailed();
            in_stack_fffffffffffffea5 = in_stack_fffffffffffffea2 ^ 0xff;
          }
        }
      }
    } while ((in_stack_fffffffffffffea5 & 1) != 0);
    QBenchmarkTestMethodData::endDataRun(QBenchmarkTestMethodData::current);
    in_stack_fffffffffffffea1 = QTestResult::skipCurrentTest();
    if ((!(bool)in_stack_fffffffffffffea1) &&
       (in_stack_fffffffffffffea0 = QTestResult::currentTestFailed(),
       !(bool)in_stack_fffffffffffffea0)) {
      if (-1 < local_e4) {
        QList<QList<QBenchmarkResult>_>::append
                  ((QList<QList<QBenchmarkResult>_> *)
                   CONCAT17(in_stack_fffffffffffffe67,
                            CONCAT16(in_stack_fffffffffffffe66,
                                     CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)))
                   ,in_stack_fffffffffffffe58);
      }
      if (((local_dd != false) && ((QBenchmarkGlobalData::current->verboseOutput & 1U) != 0)) &&
         (bVar1 = QList<QBenchmarkResult>::isEmpty((QList<QBenchmarkResult> *)0x14db56), !bVar1)) {
        pQVar6 = QList<QBenchmarkResult>::constFirst
                           ((QList<QBenchmarkResult> *)
                            CONCAT17(in_stack_fffffffffffffe67,
                                     CONCAT16(in_stack_fffffffffffffe66,
                                              CONCAT24(in_stack_fffffffffffffe64,
                                                       in_stack_fffffffffffffe60))));
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        local_70 = &DAT_aaaaaaaaaaaaaaaa;
        if (local_e4 < 0) {
          QVar9 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffffe6c,
                                              CONCAT13(in_stack_fffffffffffffe6b,
                                                       CONCAT12(in_stack_fffffffffffffe6a,
                                                                CONCAT11(in_stack_fffffffffffffe69,
                                                                         in_stack_fffffffffffffe68))
                                                      )),
                             CONCAT17(in_stack_fffffffffffffe67,
                                      CONCAT16(in_stack_fffffffffffffe66,
                                               CONCAT24(in_stack_fffffffffffffe64,
                                                        in_stack_fffffffffffffe60))));
          pcVar3 = QVar9.m_data;
        }
        else {
          QVar9 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffffe6c,
                                              CONCAT13(in_stack_fffffffffffffe6b,
                                                       CONCAT12(in_stack_fffffffffffffe6a,
                                                                CONCAT11(in_stack_fffffffffffffe69,
                                                                         in_stack_fffffffffffffe68))
                                                      )),
                             CONCAT17(in_stack_fffffffffffffe67,
                                      CONCAT16(in_stack_fffffffffffffe66,
                                               CONCAT24(in_stack_fffffffffffffe64,
                                                        in_stack_fffffffffffffe60))));
          pcVar3 = QVar9.m_data;
        }
        QVar9.m_data = (char *)in_stack_fffffffffffffe98;
        QVar9.m_size = (qsizetype)in_stack_fffffffffffffe90;
        QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         QVar9);
        in_stack_fffffffffffffe98 = (QList<QBenchmarkResult> *)(pQVar6->measurement).value;
        QChar::QChar<char16_t,_true>(&local_b2,L' ');
        QString::arg<double,_true>
                  (in_stack_fffffffffffffe78,
                   (double)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe6c,in_stack_fffffffffffffe6b,
                   CONCAT13(in_stack_fffffffffffffe67,
                            CONCAT12(in_stack_fffffffffffffe66,in_stack_fffffffffffffe64)),
                   (QChar)(char16_t)((ulong)in_stack_fffffffffffffe88.i >> 0x30));
        in_stack_fffffffffffffe90 = (QObject *)QtPrivate::asString(local_b0);
        QString::toLocal8Bit(in_stack_fffffffffffffe78);
        QByteArray::constData((QByteArray *)0x14dcae);
        QTestLog::info(pcVar3,(char *)in_stack_fffffffffffffea8.d,
                       CONCAT13(in_stack_fffffffffffffea7,
                                CONCAT12(in_stack_fffffffffffffea6,
                                         CONCAT11(in_stack_fffffffffffffea5,
                                                  in_stack_fffffffffffffea4))));
        QByteArray::~QByteArray((QByteArray *)0x14dcc9);
        QString::~QString((QString *)0x14dcd6);
        QString::~QString((QString *)0x14dce3);
      }
    }
    if (QBenchmarkGlobalData::current->minimumTotal == -1) {
      bVar1 = true;
    }
    else {
      iVar7 = QList<QList<QBenchmarkResult>_>::begin
                        ((QList<QList<QBenchmarkResult>_> *)
                         CONCAT17(in_stack_fffffffffffffe67,
                                  CONCAT16(in_stack_fffffffffffffe66,
                                           CONCAT24(in_stack_fffffffffffffe64,
                                                    in_stack_fffffffffffffe60))));
      in_stack_fffffffffffffe88 = iVar7;
      iVar8 = QList<QList<QBenchmarkResult>_>::end
                        ((QList<QList<QBenchmarkResult>_> *)
                         CONCAT17(in_stack_fffffffffffffe67,
                                  CONCAT16(in_stack_fffffffffffffe66,
                                           CONCAT24(in_stack_fffffffffffffe64,
                                                    in_stack_fffffffffffffe60))));
      in_stack_fffffffffffffe78 =
           (QString *)
           std::
           accumulate<QList<QList<QBenchmarkResult>>::iterator,double,QTest::TestMethods::invokeTestOnData(int)const::__0>
                     (0,iVar7.i,iVar8.i);
      bVar1 = (double)QBenchmarkGlobalData::current->minimumTotal <=
              (double)in_stack_fffffffffffffe78;
    }
    in_stack_fffffffffffffe74 = in_stack_fffffffffffffe74 & 0xffffff;
    if (local_dd != false) {
      local_e4 = local_e4 + 1;
      in_stack_fffffffffffffe6c = local_e4;
      in_stack_fffffffffffffe70 =
           QBenchmarkGlobalData::adjustMedianIterationCount
                     ((QBenchmarkGlobalData *)
                      CONCAT17(in_stack_fffffffffffffe67,
                               CONCAT16(in_stack_fffffffffffffe66,
                                        CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60
                                                ))));
      if ((in_stack_fffffffffffffe6c < in_stack_fffffffffffffe70) ||
         (in_stack_fffffffffffffe74 = in_stack_fffffffffffffe74 & 0xffffff, !bVar1)) {
        in_stack_fffffffffffffe6b = QTestResult::skipCurrentTest();
        in_stack_fffffffffffffe74 = in_stack_fffffffffffffe74 & 0xffffff;
        if (!(bool)in_stack_fffffffffffffe6b) {
          in_stack_fffffffffffffe6a = QTestResult::currentTestFailed();
          in_stack_fffffffffffffe74 =
               CONCAT13(in_stack_fffffffffffffe6a,(int3)in_stack_fffffffffffffe74) ^ 0xff000000;
        }
      }
    }
  } while ((in_stack_fffffffffffffe74 & 0x1000000) != 0);
  if (local_dd != false) {
    bVar1 = QTestResult::skipCurrentTest();
    bVar10 = 0;
    if (!bVar1) {
      bVar1 = QTestResult::currentTestFailed();
      bVar10 = bVar1 ^ 0xff;
    }
    QTestResult::finishedCurrentTestDataCleanup();
    if (((bVar10 & 1) != 0) &&
       (bVar1 = QBenchmarkTestMethodData::resultsAccepted(QBenchmarkTestMethodData::current), bVar1)
       ) {
      qMedian(in_stack_fffffffffffffeb0);
      QTestLog::addBenchmarkResults(in_stack_fffffffffffffe98);
      QList<QBenchmarkResult>::~QList((QList<QBenchmarkResult> *)0x14df5a);
    }
  }
  QList<QList<QBenchmarkResult>_>::~QList((QList<QList<QBenchmarkResult>_> *)0x14df92);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestMethods::invokeTestOnData(int index) const
{
    /* Benchmarking: for each median iteration*/

    bool isBenchmark = false;
    int i = (QBenchmarkGlobalData::current->measurer->needsWarmupIteration()) ? -1 : 0;

    QList<QList<QBenchmarkResult>> resultsList;
    bool minimumTotalReached = false;
    do {
        QBenchmarkTestMethodData::current->beginDataRun();
        if (i < 0)
            QBenchmarkTestMethodData::current->iterationCount = 1;

        /* Benchmarking: for each accumulation iteration*/
        bool invokeOk;
        do {
            QTest::inTestFunction = true;
            invokeTestMethodIfValid(m_initMethod);

            const bool initQuit =
                QTestResult::skipCurrentTest() || QTestResult::currentTestFailed();
            if (!initQuit) {
                QBenchmarkTestMethodData::current->results.clear();
                QBenchmarkTestMethodData::current->resultAccepted = false;
                QBenchmarkTestMethodData::current->valid = false;

                QBenchmarkGlobalData::current->context.tag = QLatin1StringView(
                    QTestResult::currentDataTag() ? QTestResult::currentDataTag() : "");

                invokeOk = invokeTestMethodIfValid(m_methods[index]);
                if (!invokeOk)
                    QTestResult::addFailure("Unable to execute slot", __FILE__, __LINE__);

                isBenchmark = QBenchmarkTestMethodData::current->isBenchmark();
            } else {
                invokeOk = false;
            }

            QTest::inTestFunction = false;
            QTestResult::finishedCurrentTestData();

            if (!initQuit) {
                invokeTestMethodIfValid(m_cleanupMethod);

                // Process any deleteLater(), used by event-loop-based apps.
                // Fixes memleak reports.
                if (QCoreApplication::instance())
                    QCoreApplication::sendPostedEvents(nullptr, QEvent::DeferredDelete);
            }
            // If the test isn't a benchmark, finalize the result after
            // cleanup() has finished (or init has lead us to skip the test).
            if (!isBenchmark)
                QTestResult::finishedCurrentTestDataCleanup();

            // If this test method has a benchmark, repeat until all measurements are
            // acceptable.
            // The QBENCHMARK macro increases the number of iterations for each run until
            // this happens.
        } while (invokeOk && isBenchmark
                 && QBenchmarkTestMethodData::current->resultsAccepted() == false
                 && !QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed());

        QBenchmarkTestMethodData::current->endDataRun();
        if (!QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed()) {
            if (i > -1)  // iteration -1 is the warmup iteration.
                resultsList.append(QBenchmarkTestMethodData::current->results);

            if (isBenchmark && QBenchmarkGlobalData::current->verboseOutput &&
                    !QBenchmarkTestMethodData::current->results.isEmpty()) {
                // we only print the first result
                const QBenchmarkResult &first = QBenchmarkTestMethodData::current->results.constFirst();
                QString pattern = i < 0 ? "warmup stage result      : %1"_L1
                                        : "accumulation stage result: %1"_L1;
                QTestLog::info(qPrintable(pattern.arg(first.measurement.value)), nullptr, 0);
            }
        }

        // Verify if the minimum total measurement (for the first measurement)
        // was reached, if it was specified:
        if (QBenchmarkGlobalData::current->minimumTotal == -1) {
            minimumTotalReached = true;
        } else {
            auto addResult = [](qreal current, const QList<QBenchmarkResult> &r) {
                if (!r.isEmpty())
                    current += r.first().measurement.value;
                return current;
            };
            const qreal total = std::accumulate(resultsList.begin(), resultsList.end(), 0.0, addResult);
            minimumTotalReached = (total >= QBenchmarkGlobalData::current->minimumTotal);
        }
    } while (isBenchmark
             && ((++i < QBenchmarkGlobalData::current->adjustMedianIterationCount()) || !minimumTotalReached)
             && !QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed());

    // If the test is a benchmark, finalize the result after all iterations have finished.
    if (isBenchmark) {
        bool testPassed = !QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed();
        QTestResult::finishedCurrentTestDataCleanup();
        // Only report benchmark figures if the test passed
        if (testPassed && QBenchmarkTestMethodData::current->resultsAccepted())
            QTestLog::addBenchmarkResults(qMedian(resultsList));
    }
}